

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O3

void anon_unknown.dwarf_444b6::addUserAttributesToHeader(Header *hdr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int a4;
  float a3;
  StringVector a15;
  double a12;
  V3i a10;
  V2i a8;
  string a7;
  Chromaticities a13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [4];
  undefined4 local_240;
  undefined4 local_23c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  undefined8 local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined8 local_208;
  undefined8 local_1fc;
  undefined4 local_1f4;
  undefined8 local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Chromaticities local_38 [32];
  
  local_188 = 0x200000001;
  uStack_180 = 0x400000003;
  local_198 = 0x402000003fc00000;
  uStack_190 = 0x4090000040600000;
  local_23c = 0x40490fd0;
  local_240 = 0x11;
  local_178 = 0x4140000041300000;
  uStack_170 = 0x4160000041500000;
  local_168 = 0x4180000041700000;
  uStack_160 = 0x4190000041880000;
  local_158 = 0x41980000;
  local_78 = 0x400000003f800000;
  uStack_70 = 0x4080000040400000;
  local_68 = 0x40c0000040a00000;
  uStack_60 = 0x4100000040e00000;
  local_58 = 0x4120000041100000;
  uStack_50 = 0x4140000041300000;
  local_48 = 0x41500000;
  uStack_44 = 0x41600000;
  uStack_40 = 0x41700000;
  uStack_3c = 0x41800000;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"extensive rebuilding by Nebuchadrezzar has left","");
  local_1f0 = 0x1c0000001b;
  local_208 = 0x41e4000041dc0000;
  local_1fc = 0x2600000025;
  local_1f4 = 0x27;
  local_218 = 0x421a000042160000;
  local_210 = 0x421e0000;
  local_220 = 0x401c7e62b51e06e0;
  local_2c8[0]._M_dataplus._M_p = (pointer)0x400000003f800000;
  local_f8 = 0x4080000040400000;
  local_148 = 0x40c0000040a00000;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4100000040e00000;
  Imf_3_2::Chromaticities::Chromaticities
            (local_38,(Vec2 *)local_2c8,(Vec2 *)&local_f8,(Vec2 *)&local_148,(Vec2 *)&local_238);
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_2c8[0].field_2;
  local_2c8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"who can spin","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
             local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8[0]._M_dataplus._M_p,local_2c8[0].field_2._M_allocated_capacity + 1);
  }
  local_2c8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
             local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8[0]._M_dataplus._M_p,local_2c8[0].field_2._M_allocated_capacity + 1);
  }
  local_2c8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"straw into","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
             local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8[0]._M_dataplus._M_p,local_2c8[0].field_2._M_allocated_capacity + 1);
  }
  local_2c8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"gold","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
             local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8[0]._M_dataplus._M_p,local_2c8[0].field_2._M_allocated_capacity + 1);
  }
  local_148 = 0x4028000000000000;
  uStack_140 = 0x402a000000000000;
  local_138 = 0x402c000000000000;
  uStack_130 = 0x402e000000000000;
  local_128 = 0x4030000000000000;
  uStack_120 = 0x4031000000000000;
  local_118 = 0x4032000000000000;
  uStack_110 = 0x4033000000000000;
  local_108 = 0x4034000000000000;
  local_f8 = 0x4000000000000000;
  uStack_f0 = 0x4008000000000000;
  local_e8 = 0x4010000000000000;
  uStack_e0 = 0x4014000000000000;
  local_d8 = 0x4018000000000000;
  uStack_d0 = 0x401c000000000000;
  local_c8 = 0x4020000000000000;
  uStack_c0 = 0x4022000000000000;
  local_b8 = 0x4024000000000000;
  uStack_b0 = 0x4026000000000000;
  local_a8 = 0x4028000000000000;
  uStack_a0 = 0x402a000000000000;
  local_98 = 0x402c000000000000;
  uStack_90 = 0x402e000000000000;
  local_88 = 0x4030000000000000;
  uStack_80 = 0x4031000000000000;
  local_1a8 = 0x403b828f5c28f5c3;
  uStack_1a0 = 0x403c828f5c28f5c3;
  local_1c8 = 0x4042c147ae147ae1;
  uStack_1c0 = 0x40434147ae147ae1;
  local_1b8 = 0x4043c147ae147ae1;
  Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::TypedAttribute((Box *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bcf59);
  Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::TypedAttribute((Box *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bcfec);
  Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>> *)local_2c8);
  Imf_3_2::TypedAttribute<float>::TypedAttribute((float *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd025);
  Imf_3_2::TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)local_2c8);
  Imf_3_2::TypedAttribute<int>::TypedAttribute((int *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd05c);
  Imf_3_2::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix33<float>>::TypedAttribute((Matrix33 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd094);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix33<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<float>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<float>>::TypedAttribute((Matrix44 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd0cc);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<float>> *)local_2c8);
  Imf_3_2::TypedAttribute<std::__cxx11::string>::TypedAttribute((string *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd106);
  Imf_3_2::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec2<int>>::TypedAttribute((Vec2 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd13d);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec2<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<int>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>>::TypedAttribute((Vec2 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd174);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<float>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec3<int>>::TypedAttribute((Vec3 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd1ac);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec3<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<int>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec3<float>>::TypedAttribute((Vec3 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd1e5);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec3<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<float>> *)local_2c8);
  Imf_3_2::TypedAttribute<double>::TypedAttribute((double *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd221);
  Imf_3_2::TypedAttribute<double>::~TypedAttribute((TypedAttribute<double> *)local_2c8);
  Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::TypedAttribute((Chromaticities *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)"a13");
  Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_2::Chromaticities> *)local_2c8);
  Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  TypedAttribute((vector *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)"a15");
  Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  ~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix33<double>>::TypedAttribute((Matrix33 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd549);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix33<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<double>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<double>>::TypedAttribute((Matrix44 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd583);
  Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<double>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec2<double>>::TypedAttribute((Vec2 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd5bc);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec2<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<double>> *)local_2c8);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec3<double>>::TypedAttribute((Vec3 *)local_2c8);
  Imf_3_2::Header::insert((char *)hdr,(Attribute *)0x1bd5f5);
  Imf_3_2::TypedAttribute<Imath_3_2::Vec3<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<double>> *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  return;
}

Assistant:

void
addUserAttributesToHeader (OPENEXR_IMF_NAMESPACE::Header& hdr)
{
    Box2i          a1 (V2i (1, 2), V2i (3, 4));
    Box2f          a2 (V2f (1.5, 2.5), V2f (3.5, 4.5));
    float          a3 (3.14159);
    int            a4 (17);
    M33f           a5 (11, 12, 13, 14, 15, 16, 17, 18, 19);
    M44f           a6 (1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16);
    string         a7 ("extensive rebuilding by Nebuchadrezzar has left");
    V2i            a8 (27, 28);
    V2f            a9 (27.5, 28.5);
    V3i            a10 (37, 38, 39);
    V3f            a11 (37.5, 38.5, 39.5);
    double         a12 (7.12342341419);
    Chromaticities a13 (V2f (1, 2), V2f (3, 4), V2f (5, 6), V2f (7, 8));
    //    Envmap a14 (ENVMAP_CUBE);
    StringVector a15;
    a15.push_back ("who can spin");
    a15.push_back ("");
    a15.push_back ("straw into");
    a15.push_back ("gold");

    M33d a16 (12, 13, 14, 15, 16, 17, 18, 19, 20);
    M44d a17 (2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17);
    V2d  a18 (27.51, 28.51);
    V3d  a19 (37.51, 38.51, 39.51);

    hdr.insert ("a1", Box2iAttribute (a1));
    hdr.insert ("a2", Box2fAttribute (a2));
    hdr.insert ("a3", FloatAttribute (a3));
    hdr.insert ("a4", IntAttribute (a4));
    hdr.insert ("a5", M33fAttribute (a5));
    hdr.insert ("a6", M44fAttribute (a6));
    hdr.insert ("a7", StringAttribute (a7));
    hdr.insert ("a8", V2iAttribute (a8));
    hdr.insert ("a9", V2fAttribute (a9));
    hdr.insert ("a10", V3iAttribute (a10));
    hdr.insert ("a11", V3fAttribute (a11));
    hdr.insert ("a12", DoubleAttribute (a12));
    hdr.insert ("a13", ChromaticitiesAttribute (a13));
    //    hdr.insert ("a14", EnvmapAttribute         (a14));
    hdr.insert ("a15", StringVectorAttribute (a15));
    hdr.insert ("a16", M33dAttribute (a16));
    hdr.insert ("a17", M44dAttribute (a17));
    hdr.insert ("a18", V2dAttribute (a18));
    hdr.insert ("a19", V3dAttribute (a19));
}